

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_7::Validator::BeginIfExceptExpr(Validator *this,IfExceptExpr *expr)

{
  Result RVar1;
  Location *loc;
  Exception *local_40;
  Exception *except;
  TypeVector except_sig;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckBlockDeclaration(this,loc,(Opcode)0xa,&(expr->true_).decl);
  except = (Exception *)0x0;
  except_sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  except_sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RVar1 = CheckExceptVar(this,&expr->except_var,&local_40);
  if (RVar1.enum_ == Ok) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&except,&local_40->sig);
  }
  TypeChecker::OnIfExcept
            (&this->typechecker_,&(expr->true_).decl.sig.param_types,
             &(expr->true_).decl.sig.result_types,(TypeVector *)&except);
  if (except != (Exception *)0x0) {
    operator_delete(except);
  }
  return (Result)Ok;
}

Assistant:

Result Validator::BeginIfExceptExpr(IfExceptExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::IfExcept, &expr->true_.decl);
  const Exception* except;
  TypeVector except_sig;
  if (Succeeded(CheckExceptVar(&expr->except_var, &except))) {
    except_sig = except->sig;
  }
  typechecker_.OnIfExcept(expr->true_.decl.sig.param_types,
                          expr->true_.decl.sig.result_types, except_sig);
  return Result::Ok;
}